

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O3

bool __thiscall xray_re::xr_ini_file::load_include(xr_ini_file *this,char *path)

{
  bool bVar1;
  int iVar2;
  xr_reader *pxVar3;
  char *format;
  
  if ((xr_file_system::instance()::instance0 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&xr_file_system::instance()::instance0), iVar2 != 0)) {
    xr_file_system::xr_file_system(&xr_file_system::instance::instance0);
    __cxa_atexit(xr_file_system::~xr_file_system,&xr_file_system::instance::instance0,&__dso_handle)
    ;
    __cxa_guard_release(&xr_file_system::instance()::instance0);
  }
  pxVar3 = xr_file_system::r_open(&xr_file_system::instance::instance0,path);
  if (pxVar3 == (xr_reader *)0x0) {
    format = "can\'t include %s";
  }
  else {
    if (pxVar3->m_end < pxVar3->m_data) {
      __assert_fail("m_data <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                    ,0x7a,"size_t xray_re::xr_reader::size() const");
    }
    bVar1 = parse(this,(pxVar3->field_2).m_p_s8,
                  (pxVar3->field_2).m_p_s8 + ((long)pxVar3->m_end - (long)pxVar3->m_data),path);
    (*pxVar3->_vptr_xr_reader[1])(pxVar3);
    if (bVar1) {
      return true;
    }
    format = "can\'t parse %s";
  }
  msg(format,path);
  return false;
}

Assistant:

bool xr_ini_file::load_include(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0) {
		msg("can't include %s", path);
		return false;
	}
	const char* p = r->pointer<const char>();
	bool status = parse(p, p + r->size(), path);
	fs.r_close(r);
	if (status)
		return true;
	msg("can't parse %s", path);
	return false;
}